

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void proc_rec_opt(Telnet *telnet,int cmd,int option)

{
  int iVar1;
  Opt *o;
  Opt **ppOVar2;
  int iVar3;
  
  log_option(telnet,"server",cmd,option);
  ppOVar2 = opts;
  do {
    o = *ppOVar2;
    if (o == (Opt *)0x0) {
      if ((cmd != 0xfd) && (cmd != 0xfb)) {
        return;
      }
      iVar3 = (uint)(cmd == 0xfb) * 2 + 0xfc;
LAB_001396d1:
      send_opt(telnet,iVar3,option);
      return;
    }
    if (o->option == option) {
      if (o->ack == cmd) {
        iVar3 = o->index;
        iVar1 = telnet->opt_states[iVar3];
        if (iVar1 != 3) {
          if (iVar1 == 2) {
            telnet->opt_states[iVar3] = 1;
            send_opt(telnet,o->send,option);
          }
          else {
            if (iVar1 != 0) {
              return;
            }
            telnet->opt_states[iVar3] = 1;
          }
          activate_option(telnet,o);
          return;
        }
        iVar3 = o->nsend;
        goto LAB_001396d1;
      }
      if (o->nak == cmd) {
        iVar3 = o->index;
        if (telnet->opt_states[iVar3] == 1) {
          telnet->opt_states[iVar3] = 2;
          send_opt(telnet,o->nsend,option);
        }
        else {
          if (telnet->opt_states[iVar3] != 0) {
            return;
          }
          telnet->opt_states[iVar3] = 2;
          if (((o->send == 0xfb) && (o->option == 0x27)) && (telnet->opt_states[3] == 2)) {
            send_opt(telnet,0xfb,0x24);
            telnet->opt_states[3] = 0;
          }
        }
        option_side_effects(telnet,o,false);
        return;
      }
    }
    ppOVar2 = ppOVar2 + 1;
  } while( true );
}

Assistant:

static void proc_rec_opt(Telnet *telnet, int cmd, int option)
{
    const struct Opt *const *o;

    log_option(telnet, "server", cmd, option);
    for (o = opts; *o; o++) {
        if ((*o)->option == option && (*o)->ack == cmd) {
            switch (telnet->opt_states[(*o)->index]) {
              case REQUESTED:
                telnet->opt_states[(*o)->index] = ACTIVE;
                activate_option(telnet, *o);
                break;
              case ACTIVE:
                break;
              case INACTIVE:
                telnet->opt_states[(*o)->index] = ACTIVE;
                send_opt(telnet, (*o)->send, option);
                activate_option(telnet, *o);
                break;
              case REALLY_INACTIVE:
                send_opt(telnet, (*o)->nsend, option);
                break;
            }
            return;
        } else if ((*o)->option == option && (*o)->nak == cmd) {
            switch (telnet->opt_states[(*o)->index]) {
              case REQUESTED:
                telnet->opt_states[(*o)->index] = INACTIVE;
                refused_option(telnet, *o);
                break;
              case ACTIVE:
                telnet->opt_states[(*o)->index] = INACTIVE;
                send_opt(telnet, (*o)->nsend, option);
                option_side_effects(telnet, *o, false);
                break;
              case INACTIVE:
              case REALLY_INACTIVE:
                break;
            }
            return;
        }
    }
    /*
     * If we reach here, the option was one we weren't prepared to
     * cope with. If the request was positive (WILL or DO), we send
     * a negative ack to indicate refusal. If the request was
     * negative (WONT / DONT), we must do nothing.
     */
    if (cmd == WILL || cmd == DO)
        send_opt(telnet, (cmd == WILL ? DONT : WONT), option);
}